

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzDDD.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChNodeFEAxyzDDD::NodeIntStateScatter
          (ChNodeFEAxyzDDD *this,uint off_x,ChState *x,uint off_v,ChStateDelta *v,double T)

{
  double *local_140;
  undefined8 local_138;
  ChState *local_128;
  ulong local_120;
  long local_110;
  ChVector<double> local_108;
  ChVector<double> local_e8;
  ChVector<double> local_c8;
  ChVector<double> local_a8;
  ChVector<double> local_88;
  ChVector<double> local_68;
  ChVector<double> local_48;
  
  local_120 = (ulong)off_x;
  local_140 = (x->super_ChVectorDynamic<double>).
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
              local_120;
  local_110 = (x->super_ChVectorDynamic<double>).
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  local_138 = 3;
  local_128 = x;
  if ((long)local_120 <= local_110 + -3) {
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
              (&local_108,
               (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                *)&local_140,(type *)0x0);
    if ((ChVector<double> *)
        &(this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.super_ChNodeFEAxyz.super_ChNodeFEAbase.
         field_0x20 != &local_108) {
      *(double *)
       &(this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.super_ChNodeFEAxyz.super_ChNodeFEAbase.
        field_0x20 = local_108.m_data[0];
      *(double *)&(this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.super_ChNodeFEAxyz.field_0x28 =
           local_108.m_data[1];
      *(double *)&(this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.super_ChNodeFEAxyz.field_0x30 =
           local_108.m_data[2];
    }
    local_120 = (ulong)(off_x + 3);
    local_110 = (x->super_ChVectorDynamic<double>).
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    local_140 = (x->super_ChVectorDynamic<double>).
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
                local_120;
    local_138 = 3;
    local_128 = x;
    if ((long)local_120 <= local_110 + -3) {
      ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
                (&local_48,
                 (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                  *)&local_140,(type *)0x0);
      if ((ChVector<double> *)
          &(this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.super_ChNodeFEAxyz.field_0xf0 !=
          &local_48) {
        *(double *)&(this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.super_ChNodeFEAxyz.field_0xf0 =
             local_48.m_data[0];
        *(double *)&(this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.field_0xf8 = local_48.m_data[1]
        ;
        *(double *)&(this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.field_0x100 =
             local_48.m_data[2];
      }
      local_120 = (ulong)(off_x + 6);
      local_110 = (x->super_ChVectorDynamic<double>).
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      local_140 = (x->super_ChVectorDynamic<double>).
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
                  local_120;
      local_138 = 3;
      local_128 = x;
      if ((long)local_120 <= local_110 + -3) {
        ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
                  (&local_68,
                   (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                    *)&local_140,(type *)0x0);
        if ((ChVector<double> *)&(this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.field_0x140 !=
            &local_68) {
          *(double *)&(this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.field_0x140 =
               local_68.m_data[0];
          *(double *)&(this->super_ChNodeFEAxyzDD).field_0x148 = local_68.m_data[1];
          *(double *)&(this->super_ChNodeFEAxyzDD).field_0x150 = local_68.m_data[2];
        }
        local_120 = (ulong)(off_x + 9);
        local_110 = (x->super_ChVectorDynamic<double>).
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
        local_140 = (x->super_ChVectorDynamic<double>).
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                    + local_120;
        local_138 = 3;
        local_128 = x;
        if ((long)local_120 <= local_110 + -3) {
          ChVector<double>::
          ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
                    (&local_88,
                     (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                      *)&local_140,(type *)0x0);
          if ((ChVector<double> *)&(this->super_ChNodeFEAxyzDD).field_0x190 != &local_88) {
            *(double *)&(this->super_ChNodeFEAxyzDD).field_0x190 = local_88.m_data[0];
            *(double *)&this->field_0x198 = local_88.m_data[1];
            *(double *)&this->field_0x1a0 = local_88.m_data[2];
          }
          local_120 = (ulong)off_v;
          local_140 = (v->super_ChVectorDynamic<double>).
                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                      m_data + local_120;
          local_110 = (v->super_ChVectorDynamic<double>).
                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                      m_rows;
          local_138 = 3;
          local_128 = (ChState *)v;
          if ((long)local_120 <= local_110 + -3) {
            ChVector<double>::
            ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
                      (&local_108,
                       (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                        *)&local_140,(type *)0x0);
            if ((ChVector<double> *)
                &(this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.super_ChNodeFEAxyz.field_0x38 !=
                &local_108) {
              *(double *)
               &(this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.super_ChNodeFEAxyz.field_0x38 =
                   local_108.m_data[0];
              *(double *)
               &(this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.super_ChNodeFEAxyz.field_0x40 =
                   local_108.m_data[1];
              *(double *)
               &(this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.super_ChNodeFEAxyz.field_0x48 =
                   local_108.m_data[2];
            }
            local_120 = (ulong)(off_v + 3);
            local_110 = (v->super_ChVectorDynamic<double>).
                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                        m_rows;
            local_140 = (v->super_ChVectorDynamic<double>).
                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                        m_data + local_120;
            local_138 = 3;
            local_128 = (ChState *)v;
            if ((long)local_120 <= local_110 + -3) {
              ChVector<double>::
              ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
                        (&local_a8,
                         (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                          *)&local_140,(type *)0x0);
              if (&(this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.D_dt != &local_a8) {
                (this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.D_dt.m_data[0] = local_a8.m_data[0]
                ;
                (this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.D_dt.m_data[1] = local_a8.m_data[1]
                ;
                (this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.D_dt.m_data[2] = local_a8.m_data[2]
                ;
              }
              local_120 = (ulong)(off_v + 6);
              local_110 = (v->super_ChVectorDynamic<double>).
                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                          m_rows;
              local_140 = (v->super_ChVectorDynamic<double>).
                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                          m_data + local_120;
              local_138 = 3;
              local_128 = (ChState *)v;
              if ((long)local_120 <= local_110 + -3) {
                ChVector<double>::
                ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
                          (&local_c8,
                           (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                            *)&local_140,(type *)0x0);
                if (&(this->super_ChNodeFEAxyzDD).DD_dt != &local_c8) {
                  (this->super_ChNodeFEAxyzDD).DD_dt.m_data[0] = local_c8.m_data[0];
                  (this->super_ChNodeFEAxyzDD).DD_dt.m_data[1] = local_c8.m_data[1];
                  (this->super_ChNodeFEAxyzDD).DD_dt.m_data[2] = local_c8.m_data[2];
                }
                local_120 = (ulong)(off_v + 9);
                local_110 = (v->super_ChVectorDynamic<double>).
                            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                            .m_rows;
                local_140 = (v->super_ChVectorDynamic<double>).
                            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                            .m_data + local_120;
                local_138 = 3;
                local_128 = (ChState *)v;
                if ((long)local_120 <= local_110 + -3) {
                  ChVector<double>::
                  ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
                            (&local_e8,
                             (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                              *)&local_140,(type *)0x0);
                  if (&this->DDD_dt != &local_e8) {
                    (this->DDD_dt).m_data[0] = local_e8.m_data[0];
                    (this->DDD_dt).m_data[1] = local_e8.m_data[1];
                    (this->DDD_dt).m_data[2] = local_e8.m_data[2];
                  }
                  return;
                }
              }
            }
          }
        }
      }
    }
  }
  local_138 = 3;
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

void ChNodeFEAxyzDDD::NodeIntStateScatter(const unsigned int off_x,
                                         const ChState& x,
                                         const unsigned int off_v,
                                         const ChStateDelta& v,
                                         const double T) {
    SetPos(x.segment(off_x, 3));
    SetD(x.segment(off_x + 3, 3));
    SetDD(x.segment(off_x + 6, 3));
	SetDDD(x.segment(off_x + 9, 3));

    SetPos_dt(v.segment(off_v, 3));
    SetD_dt(v.segment(off_v + 3, 3));
    SetDD_dt(v.segment(off_v + 6, 3));
	SetDDD_dt(v.segment(off_v + 9, 3));
}